

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppjit.hpp
# Opt level: O1

void __thiscall
cppjit::kernel<bool,_cppjit::detail::pack<int>_>::set_builder
          (kernel<bool,_cppjit::detail::pack<int>_> *this,
          shared_ptr<cppjit::builder::builder> *builder_)

{
  builder *this_00;
  cppjit_exception *this_01;
  string local_40;
  
  this_00 = (this->builder).super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_00 != (builder *)0x0) {
    builder::builder::clear(this_00);
    (this->builder).super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (builder_->super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->builder).
                super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,&(builder_->super___shared_ptr<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount);
    return;
  }
  this_01 = (cppjit_exception *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"builder is invalid","");
  cppjit_exception::cppjit_exception(this_01,&local_40);
  __cxa_throw(this_01,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
}

Assistant:

void set_builder(std::shared_ptr<cppjit::builder::builder> builder_) {
    if (!builder) {
      throw cppjit::cppjit_exception("builder is invalid");
    }
    builder->clear();
    builder = builder_;
  }